

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [16];
  Intersectors *pIVar15;
  Geometry *pGVar16;
  RTCIntersectArguments *pRVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  int iVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  int *piVar28;
  RTCRayQueryContext *pRVar29;
  undefined8 uVar30;
  ulong uVar31;
  Intersectors *pIVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  float fVar38;
  float fVar49;
  float fVar50;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar51;
  undefined1 auVar48 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar63;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar67;
  float fVar69;
  undefined1 auVar65 [16];
  float fVar68;
  float fVar70;
  undefined1 auVar66 [16];
  float fVar71;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar78;
  float fVar79;
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1188;
  int local_115c;
  undefined1 local_1158 [16];
  float local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  RTCFilterFunctionNArguments local_1128;
  Geometry *local_10f8;
  Scene *local_10f0;
  float local_10e8;
  undefined4 local_10e4;
  float local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar24 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar104 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar107 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar98 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar101 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar13 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar60._0_4_ = 0.0;
    if (0.0 <= fVar101) {
      auVar60._0_4_ = fVar101;
    }
    fVar101 = (ray->super_RayK<1>).tfar;
    auVar39._4_4_ = -(uint)(ABS(aVar13.y) < DAT_01f80d30._4_4_);
    auVar39._0_4_ = -(uint)(ABS(aVar13.x) < (float)DAT_01f80d30);
    auVar39._8_4_ = -(uint)(ABS(aVar13.z) < DAT_01f80d30._8_4_);
    auVar39._12_4_ = -(uint)(ABS(aVar13.field_3.w) < DAT_01f80d30._12_4_);
    auVar72 = blendvps((undefined1  [16])aVar13,_DAT_01f80d30,auVar39);
    fVar68 = 0.0;
    if (0.0 <= fVar101) {
      fVar68 = fVar101;
    }
    auVar39 = rcpps(auVar39,auVar72);
    fVar102 = auVar39._0_4_;
    fVar105 = auVar39._4_4_;
    fVar108 = auVar39._8_4_;
    fVar102 = (1.0 - auVar72._0_4_ * fVar102) * fVar102 + fVar102;
    fVar105 = (1.0 - auVar72._4_4_ * fVar105) * fVar105 + fVar105;
    fVar108 = (1.0 - auVar72._8_4_ * fVar108) * fVar108 + fVar108;
    uVar36 = (ulong)(fVar102 < 0.0) * 0x10;
    uVar31 = (ulong)(fVar105 < 0.0) << 4 | 0x20;
    uVar37 = (ulong)(fVar108 < 0.0) << 4 | 0x40;
    auVar72._4_4_ = fVar68;
    auVar72._0_4_ = fVar68;
    auVar72._8_4_ = fVar68;
    auVar72._12_4_ = fVar68;
    _local_f88 = mm_lookupmask_ps._240_8_;
    _uStack_f80 = mm_lookupmask_ps._248_8_;
    local_f98 = fVar98;
    fStack_f94 = fVar98;
    fStack_f90 = fVar98;
    fStack_f8c = fVar98;
    local_fa8 = auVar60._0_4_;
    fStack_fa4 = auVar60._0_4_;
    fStack_fa0 = auVar60._0_4_;
    fStack_f9c = auVar60._0_4_;
    local_fb8 = fVar108;
    fStack_fb4 = fVar108;
    fStack_fb0 = fVar108;
    fStack_fac = fVar108;
    local_fc8 = fVar104;
    fStack_fc4 = fVar104;
    fStack_fc0 = fVar104;
    fStack_fbc = fVar104;
    local_fd8 = fVar107;
    fStack_fd4 = fVar107;
    fStack_fd0 = fVar107;
    fStack_fcc = fVar107;
    local_fe8 = fVar102;
    fStack_fe4 = fVar102;
    fStack_fe0 = fVar102;
    fStack_fdc = fVar102;
    local_ff8 = fVar105;
    fStack_ff4 = fVar105;
    fStack_ff0 = fVar105;
    fStack_fec = fVar105;
    fVar84 = fVar105;
    fVar79 = fVar105;
    fVar78 = fVar105;
    fVar77 = fVar102;
    fVar71 = fVar102;
    fVar70 = fVar102;
    fVar69 = fVar107;
    fVar67 = fVar107;
    fVar64 = fVar107;
    fVar63 = fVar104;
    fVar62 = fVar104;
    fVar61 = fVar104;
    fVar57 = fVar108;
    fVar56 = fVar108;
    fVar55 = fVar108;
    fVar52 = auVar60._0_4_;
    fVar51 = auVar60._0_4_;
    fVar50 = auVar60._0_4_;
    fVar49 = fVar98;
    fVar38 = fVar98;
    fVar68 = fVar98;
LAB_00d91a99:
    do {
      pauVar25 = pauVar24 + -1;
      pauVar24 = pauVar24 + -1;
      if (*(float *)((long)*pauVar25 + 8) <= fVar101) {
        pIVar32 = *(Intersectors **)*pauVar24;
        while (((ulong)pIVar32 & 8) == 0) {
          fVar85 = (ray->super_RayK<1>).dir.field_0.m128[3];
          fVar101 = (ray->super_RayK<1>).tfar;
          uVar27 = (ulong)pIVar32 & 0xfffffffffffffff0;
          pfVar5 = (float *)(uVar27 + 0x80 + uVar36);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar36);
          auVar76._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar61) * fVar70;
          auVar76._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar62) * fVar71;
          auVar76._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar63) * fVar77;
          auVar76._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar104) * fVar102;
          auVar73._4_4_ = fVar51;
          auVar73._0_4_ = fVar50;
          auVar73._8_4_ = fVar52;
          auVar73._12_4_ = auVar60._0_4_;
          auVar39 = maxps(auVar73,auVar76);
          pfVar5 = (float *)(uVar27 + 0x80 + uVar31);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar31);
          auVar83._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar64) * fVar78;
          auVar83._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar67) * fVar79;
          auVar83._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar69) * fVar84;
          auVar83._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar107) * fVar105;
          pfVar5 = (float *)(uVar27 + 0x80 + uVar37);
          pfVar1 = (float *)(uVar27 + 0x20 + uVar37);
          auVar80._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar68) * fVar55;
          auVar80._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar38) * fVar56;
          auVar80._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar49) * fVar57;
          auVar80._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar98) * fVar108;
          auVar73 = maxps(auVar83,auVar80);
          _local_10b8 = maxps(auVar39,auVar73);
          pfVar5 = (float *)(uVar27 + 0x80 + (uVar36 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar36 ^ 0x10));
          auVar81._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar61) * fVar70;
          auVar81._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar62) * fVar71;
          auVar81._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar63) * fVar77;
          auVar81._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar104) * fVar102;
          pfVar5 = (float *)(uVar27 + 0x80 + (uVar31 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar31 ^ 0x10));
          auVar86._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar64) * fVar78;
          auVar86._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar67) * fVar79;
          auVar86._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar69) * fVar84;
          auVar86._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar107) * fVar105;
          pfVar5 = (float *)(uVar27 + 0x80 + (uVar37 ^ 0x10));
          pfVar1 = (float *)(uVar27 + 0x20 + (uVar37 ^ 0x10));
          auVar88._0_4_ = ((*pfVar5 * fVar85 + *pfVar1) - fVar68) * fVar55;
          auVar88._4_4_ = ((pfVar5[1] * fVar85 + pfVar1[1]) - fVar38) * fVar56;
          auVar88._8_4_ = ((pfVar5[2] * fVar85 + pfVar1[2]) - fVar49) * fVar57;
          auVar88._12_4_ = ((pfVar5[3] * fVar85 + pfVar1[3]) - fVar98) * fVar108;
          auVar73 = minps(auVar86,auVar88);
          auVar39 = minps(auVar72,auVar81);
          auVar39 = minps(auVar39,auVar73);
          if (((uint)pIVar32 & 7) == 6) {
            bVar18 = (fVar85 < *(float *)(uVar27 + 0xf0) && *(float *)(uVar27 + 0xe0) <= fVar85) &&
                     local_10b8._0_4_ <= auVar39._0_4_;
            bVar19 = (fVar85 < *(float *)(uVar27 + 0xf4) && *(float *)(uVar27 + 0xe4) <= fVar85) &&
                     local_10b8._4_4_ <= auVar39._4_4_;
            bVar20 = (fVar85 < *(float *)(uVar27 + 0xf8) && *(float *)(uVar27 + 0xe8) <= fVar85) &&
                     local_10b8._8_4_ <= auVar39._8_4_;
            bVar21 = (fVar85 < *(float *)(uVar27 + 0xfc) && *(float *)(uVar27 + 0xec) <= fVar85) &&
                     local_10b8._12_4_ <= auVar39._12_4_;
          }
          else {
            bVar18 = local_10b8._0_4_ <= auVar39._0_4_;
            bVar19 = local_10b8._4_4_ <= auVar39._4_4_;
            bVar20 = local_10b8._8_4_ <= auVar39._8_4_;
            bVar21 = local_10b8._12_4_ <= auVar39._12_4_;
          }
          auVar58._0_4_ = (uint)bVar18 * -0x80000000;
          auVar58._4_4_ = (uint)bVar19 * -0x80000000;
          auVar58._8_4_ = (uint)bVar20 * -0x80000000;
          auVar58._12_4_ = (uint)bVar21 * -0x80000000;
          uVar34 = movmskps((int)This,auVar58);
          This = (Intersectors *)(ulong)uVar34;
          if (uVar34 == 0) {
            if (pauVar24 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d91a99;
          }
          This = (Intersectors *)0x0;
          if ((byte)uVar34 != 0) {
            for (; ((byte)uVar34 >> (long)This & 1) == 0;
                This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          pIVar32 = *(Intersectors **)(uVar27 + (long)This * 8);
          uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
          if (uVar34 != 0) {
            uVar117 = *(uint *)(local_10b8 + (long)This * 4);
            lVar35 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            pIVar15 = *(Intersectors **)(uVar27 + lVar35 * 8);
            uVar118 = *(uint *)(local_10b8 + lVar35 * 4);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              This = pIVar15;
              if (uVar117 < uVar118) {
                *(Intersectors **)*pauVar24 = pIVar15;
                *(uint *)((long)*pauVar24 + 8) = uVar118;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(Intersectors **)*pauVar24 = pIVar32;
                *(uint *)((long)*pauVar24 + 8) = uVar117;
                pauVar24 = pauVar24 + 1;
                pIVar32 = pIVar15;
              }
            }
            else {
              auVar59._8_4_ = uVar117;
              auVar59._0_8_ = pIVar32;
              auVar59._12_4_ = 0;
              auVar74._8_4_ = uVar118;
              auVar74._0_8_ = pIVar15;
              auVar74._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar34 != 0) {
                for (; (uVar34 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&This->ptr + 1)) {
                }
              }
              uVar30 = *(undefined8 *)(uVar27 + (long)This * 8);
              iVar23 = *(int *)(local_10b8 + (long)This * 4);
              auVar65._8_4_ = iVar23;
              auVar65._0_8_ = uVar30;
              auVar65._12_4_ = 0;
              auVar40._8_4_ = -(uint)((int)uVar117 < (int)uVar118);
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar82._8_4_ = uVar118;
                auVar82._0_8_ = pIVar15;
                auVar82._12_4_ = 0;
                auVar73 = blendvps(auVar82,auVar59,auVar40);
                auVar39 = blendvps(auVar59,auVar74,auVar40);
                auVar41._8_4_ = -(uint)(auVar73._8_4_ < iVar23);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar75._8_4_ = iVar23;
                auVar75._0_8_ = uVar30;
                auVar75._12_4_ = 0;
                auVar76 = blendvps(auVar75,auVar73,auVar41);
                auVar83 = blendvps(auVar73,auVar65,auVar41);
                auVar42._8_4_ = -(uint)(auVar39._8_4_ < auVar83._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar73 = blendvps(auVar83,auVar39,auVar42);
                auVar39 = blendvps(auVar39,auVar83,auVar42);
                *pauVar24 = auVar39;
                pauVar24[1] = auVar73;
                pIVar32 = auVar76._0_8_;
                pauVar24 = pauVar24 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                auVar43._4_4_ = auVar40._8_4_;
                auVar43._0_4_ = auVar40._8_4_;
                auVar43._8_4_ = auVar40._8_4_;
                auVar43._12_4_ = auVar40._8_4_;
                auVar83 = blendvps(auVar74,auVar59,auVar43);
                auVar39 = blendvps(auVar59,auVar74,auVar43);
                auVar87._8_4_ = *(int *)(local_10b8 + (long)This * 4);
                auVar87._0_8_ = *(undefined8 *)(uVar27 + (long)This * 8);
                auVar87._12_4_ = 0;
                auVar44._8_4_ = -(uint)(iVar23 < *(int *)(local_10b8 + (long)This * 4));
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar76 = blendvps(auVar87,auVar65,auVar44);
                auVar73 = blendvps(auVar65,auVar87,auVar44);
                auVar45._8_4_ = -(uint)(auVar39._8_4_ < auVar73._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar88 = blendvps(auVar73,auVar39,auVar45);
                auVar39 = blendvps(auVar39,auVar73,auVar45);
                auVar46._8_4_ = -(uint)(auVar83._8_4_ < auVar76._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar73 = blendvps(auVar76,auVar83,auVar46);
                auVar83 = blendvps(auVar83,auVar76,auVar46);
                auVar47._8_4_ = -(uint)(auVar83._8_4_ < auVar88._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar76 = blendvps(auVar88,auVar83,auVar47);
                auVar83 = blendvps(auVar83,auVar88,auVar47);
                *pauVar24 = auVar39;
                pauVar24[1] = auVar83;
                pauVar24[2] = auVar76;
                pIVar32 = auVar73._0_8_;
                pauVar24 = pauVar24 + 3;
              }
            }
          }
        }
        uVar27 = (ulong)((uint)pIVar32 & 0xf);
        if (uVar27 != 8) {
          uVar33 = (ulong)pIVar32 & 0xfffffffffffffff0;
          lVar35 = 0;
          pauVar25 = pauVar24;
          do {
            This = (Intersectors *)(lVar35 * 0x140);
            fVar104 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar5 = (float *)((long)&(This->intersector8).occluded + uVar33);
            pfVar1 = (float *)((long)&This->ptr + uVar33);
            fVar108 = *pfVar5 * fVar104 + *pfVar1;
            fVar61 = pfVar5[1] * fVar104 + pfVar1[1];
            fVar62 = pfVar5[2] * fVar104 + pfVar1[2];
            fVar63 = pfVar5[3] * fVar104 + pfVar1[3];
            pfVar5 = (float *)((long)&(This->intersector8_filter).intersect + uVar33);
            pfVar1 = (float *)((long)&(This->collider).collide + uVar33);
            fVar103 = *pfVar5 * fVar104 + *pfVar1;
            fVar106 = pfVar5[1] * fVar104 + pfVar1[1];
            fVar109 = pfVar5[2] * fVar104 + pfVar1[2];
            fVar111 = pfVar5[3] * fVar104 + pfVar1[3];
            pfVar5 = (float *)((long)&(This->intersector8_filter).name + uVar33);
            pfVar1 = (float *)((long)&(This->intersector1).intersect + uVar33);
            fVar64 = *pfVar5 * fVar104 + *pfVar1;
            fVar67 = pfVar5[1] * fVar104 + pfVar1[1];
            fVar69 = pfVar5[2] * fVar104 + pfVar1[2];
            fVar70 = pfVar5[3] * fVar104 + pfVar1[3];
            pfVar6 = (float *)((long)&(This->intersector8_nofilter).occluded + uVar33);
            pfVar1 = (float *)((long)&(This->intersector1).pointQuery + uVar33);
            pfVar7 = (float *)((long)&(This->intersector16).intersect + uVar33);
            pfVar5 = (float *)((long)&(This->intersector4).intersect + uVar33);
            pfVar8 = (float *)((long)&(This->intersector16).name + uVar33);
            pfVar2 = (float *)((long)&(This->intersector4).name + uVar33);
            pfVar9 = (float *)((long)&(This->intersector16_filter).occluded + uVar33);
            pfVar3 = (float *)((long)&(This->intersector4_filter).occluded + uVar33);
            pfVar10 = (float *)((long)&(This->intersector16_nofilter).intersect + uVar33);
            pfVar4 = (float *)((long)&(This->intersector4_nofilter).intersect + uVar33);
            pfVar11 = (float *)((long)&(This->intersector16_nofilter).name + uVar33);
            pfVar12 = (float *)((long)&(This->intersector4_nofilter).name + uVar33);
            fVar94 = fVar108 - (*pfVar6 * fVar104 + *pfVar1);
            fVar95 = fVar61 - (pfVar6[1] * fVar104 + pfVar1[1]);
            fVar96 = fVar62 - (pfVar6[2] * fVar104 + pfVar1[2]);
            fVar97 = fVar63 - (pfVar6[3] * fVar104 + pfVar1[3]);
            fVar71 = fVar103 - (*pfVar7 * fVar104 + *pfVar5);
            fVar77 = fVar106 - (pfVar7[1] * fVar104 + pfVar5[1]);
            fVar102 = fVar109 - (pfVar7[2] * fVar104 + pfVar5[2]);
            fVar78 = fVar111 - (pfVar7[3] * fVar104 + pfVar5[3]);
            fVar113 = fVar64 - (*pfVar8 * fVar104 + *pfVar2);
            fVar114 = fVar67 - (pfVar8[1] * fVar104 + pfVar2[1]);
            fVar115 = fVar69 - (pfVar8[2] * fVar104 + pfVar2[2]);
            fVar116 = fVar70 - (pfVar8[3] * fVar104 + pfVar2[3]);
            fVar52 = (*pfVar9 * fVar104 + *pfVar3) - fVar108;
            fVar55 = (pfVar9[1] * fVar104 + pfVar3[1]) - fVar61;
            fVar56 = (pfVar9[2] * fVar104 + pfVar3[2]) - fVar62;
            fVar57 = (pfVar9[3] * fVar104 + pfVar3[3]) - fVar63;
            fVar89 = (*pfVar10 * fVar104 + *pfVar4) - fVar103;
            fVar91 = (pfVar10[1] * fVar104 + pfVar4[1]) - fVar106;
            fVar92 = (pfVar10[2] * fVar104 + pfVar4[2]) - fVar109;
            fVar93 = (pfVar10[3] * fVar104 + pfVar4[3]) - fVar111;
            fVar79 = (fVar104 * *pfVar11 + *pfVar12) - fVar64;
            fVar84 = (fVar104 * pfVar11[1] + pfVar12[1]) - fVar67;
            fVar105 = (fVar104 * pfVar11[2] + pfVar12[2]) - fVar69;
            fVar85 = (fVar104 * pfVar11[3] + pfVar12[3]) - fVar70;
            fVar38 = fVar113 * fVar89 - fVar71 * fVar79;
            fVar49 = fVar114 * fVar91 - fVar77 * fVar84;
            fVar50 = fVar115 * fVar92 - fVar102 * fVar105;
            fVar51 = fVar116 * fVar93 - fVar78 * fVar85;
            fVar104 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar107 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar98 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar101 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar60._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar108 = fVar108 - fVar104;
            fVar61 = fVar61 - fVar104;
            fVar62 = fVar62 - fVar104;
            fVar63 = fVar63 - fVar104;
            fVar103 = fVar103 - fVar107;
            fVar106 = fVar106 - fVar107;
            fVar109 = fVar109 - fVar107;
            fVar111 = fVar111 - fVar107;
            fVar125 = fVar108 * auVar60._0_4_ - fVar103 * fVar101;
            fVar126 = fVar61 * auVar60._0_4_ - fVar106 * fVar101;
            fVar127 = fVar62 * auVar60._0_4_ - fVar109 * fVar101;
            fVar128 = fVar63 * auVar60._0_4_ - fVar111 * fVar101;
            local_1018._0_4_ = fVar94 * fVar79 - fVar113 * fVar52;
            local_1018._4_4_ = fVar95 * fVar84 - fVar114 * fVar55;
            local_1018._8_4_ = fVar96 * fVar105 - fVar115 * fVar56;
            local_1018._12_4_ = fVar97 * fVar85 - fVar116 * fVar57;
            fVar64 = fVar64 - fVar98;
            fVar67 = fVar67 - fVar98;
            fVar69 = fVar69 - fVar98;
            fVar70 = fVar70 - fVar98;
            fVar121 = fVar64 * fVar101 - fVar108 * fVar68;
            fVar122 = fVar67 * fVar101 - fVar61 * fVar68;
            fVar123 = fVar69 * fVar101 - fVar62 * fVar68;
            fVar124 = fVar70 * fVar101 - fVar63 * fVar68;
            local_1008[0] = fVar71 * fVar52 - fVar94 * fVar89;
            local_1008[1] = fVar77 * fVar55 - fVar95 * fVar91;
            local_1008[2] = fVar102 * fVar56 - fVar96 * fVar92;
            local_1008[3] = fVar78 * fVar57 - fVar97 * fVar93;
            fVar104 = fVar103 * fVar68 - fVar64 * auVar60._0_4_;
            fVar107 = fVar106 * fVar68 - fVar67 * auVar60._0_4_;
            fVar110 = fVar109 * fVar68 - fVar69 * auVar60._0_4_;
            fVar112 = fVar111 * fVar68 - fVar70 * auVar60._0_4_;
            fVar98 = fVar101 * fVar38 + auVar60._0_4_ * local_1018._0_4_ + fVar68 * local_1008[0];
            fVar99 = fVar101 * fVar49 + auVar60._0_4_ * local_1018._4_4_ + fVar68 * local_1008[1];
            fVar100 = fVar101 * fVar50 + auVar60._0_4_ * local_1018._8_4_ + fVar68 * local_1008[2];
            fVar101 = fVar101 * fVar51 + auVar60._0_4_ * local_1018._12_4_ + fVar68 * local_1008[3];
            uVar117 = (uint)fVar98 & 0x80000000;
            uVar118 = (uint)fVar99 & 0x80000000;
            uVar119 = (uint)fVar100 & 0x80000000;
            uVar120 = (uint)fVar101 & 0x80000000;
            local_10b8._0_4_ =
                 (uint)(fVar52 * fVar104 + fVar89 * fVar121 + fVar79 * fVar125) ^ uVar117;
            local_10b8._4_4_ =
                 (uint)(fVar55 * fVar107 + fVar91 * fVar122 + fVar84 * fVar126) ^ uVar118;
            fStack_10b0 = (float)((uint)(fVar56 * fVar110 + fVar92 * fVar123 + fVar105 * fVar127) ^
                                 uVar119);
            fStack_10ac = (float)((uint)(fVar57 * fVar112 + fVar93 * fVar124 + fVar85 * fVar128) ^
                                 uVar120);
            local_10a8 = (float)((uint)(fVar104 * fVar94 + fVar121 * fVar71 + fVar125 * fVar113) ^
                                uVar117);
            fStack_10a4 = (float)((uint)(fVar107 * fVar95 + fVar122 * fVar77 + fVar126 * fVar114) ^
                                 uVar118);
            fStack_10a0 = (float)((uint)(fVar110 * fVar96 + fVar123 * fVar102 + fVar127 * fVar115) ^
                                 uVar119);
            fStack_109c = (float)((uint)(fVar112 * fVar97 + fVar124 * fVar78 + fVar128 * fVar116) ^
                                 uVar120);
            fVar104 = ABS(fVar98);
            fVar107 = ABS(fVar99);
            local_1088._0_8_ = CONCAT44(fVar99,fVar98) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar100);
            local_1088._12_4_ = ABS(fVar101);
            auVar90._0_4_ =
                 -(uint)((float)local_10b8._0_4_ + local_10a8 <= fVar104) &
                 -(uint)((0.0 <= local_10a8 && 0.0 <= (float)local_10b8._0_4_) && fVar98 != 0.0) &
                 local_f88;
            auVar90._4_4_ =
                 -(uint)((float)local_10b8._4_4_ + fStack_10a4 <= fVar107) &
                 -(uint)((0.0 <= fStack_10a4 && 0.0 <= (float)local_10b8._4_4_) && fVar99 != 0.0) &
                 uStack_f84;
            auVar90._8_4_ =
                 -(uint)(fStack_10b0 + fStack_10a0 <= local_1088._8_4_) &
                 -(uint)((0.0 <= fStack_10a0 && 0.0 <= fStack_10b0) && fVar100 != 0.0) & uStack_f80;
            auVar90._12_4_ =
                 -(uint)(fStack_10ac + fStack_109c <= local_1088._12_4_) &
                 -(uint)((0.0 <= fStack_109c && 0.0 <= fStack_10ac) && fVar101 != 0.0) & uStack_f7c;
            uVar34 = movmskps((int)pauVar25,auVar90);
            pauVar25 = (undefined1 (*) [16])(ulong)uVar34;
            if (uVar34 != 0) {
              local_1098 = (float)(uVar117 ^
                                  (uint)(fVar108 * fVar38 +
                                        fVar103 * local_1018._0_4_ + fVar64 * local_1008[0]));
              fStack_1094 = (float)(uVar118 ^
                                   (uint)(fVar61 * fVar49 +
                                         fVar106 * local_1018._4_4_ + fVar67 * local_1008[1]));
              fStack_1090 = (float)(uVar119 ^
                                   (uint)(fVar62 * fVar50 +
                                         fVar109 * local_1018._8_4_ + fVar69 * local_1008[2]));
              fStack_108c = (float)(uVar120 ^
                                   (uint)(fVar63 * fVar51 +
                                         fVar111 * local_1018._12_4_ + fVar70 * local_1008[3]));
              fVar98 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar14._0_4_ = (ray->super_RayK<1>).tfar;
              auVar14._4_4_ = (ray->super_RayK<1>).mask;
              auVar14._8_4_ = (ray->super_RayK<1>).id;
              auVar14._12_4_ = (ray->super_RayK<1>).flags;
              auVar48._0_4_ =
                   -(uint)(local_1098 <= (float)auVar14._0_4_ * fVar104 &&
                          fVar98 * fVar104 < local_1098) & auVar90._0_4_;
              auVar48._4_4_ =
                   -(uint)(fStack_1094 <= (float)auVar14._0_4_ * fVar107 &&
                          fVar98 * fVar107 < fStack_1094) & auVar90._4_4_;
              auVar48._8_4_ =
                   -(uint)(fStack_1090 <= (float)auVar14._0_4_ * local_1088._8_4_ &&
                          fVar98 * local_1088._8_4_ < fStack_1090) & auVar90._8_4_;
              auVar48._12_4_ =
                   -(uint)(fStack_108c <= (float)auVar14._0_4_ * local_1088._12_4_ &&
                          fVar98 * local_1088._12_4_ < fStack_108c) & auVar90._12_4_;
              uVar34 = movmskps(uVar34,auVar48);
              pauVar25 = (undefined1 (*) [16])(ulong)uVar34;
              if (uVar34 != 0) {
                local_1068 = auVar48;
                local_1028._4_4_ = fVar49;
                local_1028._0_4_ = fVar38;
                local_1028._8_4_ = fVar50;
                local_1028._12_4_ = fVar51;
                local_10f0 = context->scene;
                local_1158 = auVar48;
                auVar60 = rcpps(local_1028,local_1088);
                fVar68 = auVar60._4_4_;
                fVar38 = auVar60._8_4_;
                fVar49 = auVar60._12_4_;
                auVar60._0_4_ = (1.0 - fVar104 * auVar60._0_4_) * auVar60._0_4_ + auVar60._0_4_;
                fVar68 = (1.0 - fVar107 * fVar68) * fVar68 + fVar68;
                fVar38 = (1.0 - local_1088._8_4_ * fVar38) * fVar38 + fVar38;
                fVar49 = (1.0 - local_1088._12_4_ * fVar49) * fVar49 + fVar49;
                fVar104 = local_1098 * auVar60._0_4_;
                fVar107 = fStack_1094 * fVar68;
                fVar98 = fStack_1090 * fVar38;
                fVar101 = fStack_108c * fVar49;
                local_1038[0] = fVar104;
                local_1038[1] = fVar107;
                local_1038[2] = fVar98;
                local_1038[3] = fVar101;
                local_1058[0] = (float)local_10b8._0_4_ * auVar60._0_4_;
                local_1058[1] = (float)local_10b8._4_4_ * fVar68;
                local_1058[2] = fStack_10b0 * fVar38;
                local_1058[3] = fStack_10ac * fVar49;
                local_1048[0] = auVar60._0_4_ * local_10a8;
                local_1048[1] = fVar68 * fStack_10a4;
                local_1048[2] = fVar38 * fStack_10a0;
                local_1048[3] = fVar49 * fStack_109c;
                auVar22._4_4_ = fVar107;
                auVar22._0_4_ = fVar104;
                auVar22._8_4_ = fVar98;
                auVar22._12_4_ = fVar101;
                auVar39 = blendvps(_DAT_01f7a9f0,auVar22,auVar48);
                auVar66._4_4_ = auVar39._0_4_;
                auVar66._0_4_ = auVar39._4_4_;
                auVar66._8_4_ = auVar39._12_4_;
                auVar66._12_4_ = auVar39._8_4_;
                auVar60 = minps(auVar66,auVar39);
                auVar53._0_8_ = auVar60._8_8_;
                auVar53._8_4_ = auVar60._0_4_;
                auVar53._12_4_ = auVar60._4_4_;
                auVar60 = minps(auVar53,auVar60);
                auVar54._0_8_ =
                     CONCAT44(-(uint)(auVar60._4_4_ == auVar39._4_4_) & auVar48._4_4_,
                              -(uint)(auVar60._0_4_ == auVar39._0_4_) & auVar48._0_4_);
                auVar54._8_4_ = -(uint)(auVar60._8_4_ == auVar39._8_4_) & auVar48._8_4_;
                auVar54._12_4_ = -(uint)(auVar60._12_4_ == auVar39._12_4_) & auVar48._12_4_;
                iVar23 = movmskps((int)local_10f0,auVar54);
                if (iVar23 != 0) {
                  auVar48._8_4_ = auVar54._8_4_;
                  auVar48._0_8_ = auVar54._0_8_;
                  auVar48._12_4_ = auVar54._12_4_;
                }
                This = (Intersectors *)((long)&This->ptr + uVar33);
                local_1188 = extractps(auVar14,1);
                auVar60._4_4_ = movmskps(iVar23,auVar48);
                uVar26 = CONCAT44((int)((ulong)local_10f0 >> 0x20),auVar60._4_4_);
                piVar28 = (int *)0x0;
                auVar60._0_4_ = (float)auVar14._0_4_;
                auVar60._4_4_ = auVar14._4_4_;
                auVar60._8_4_ = auVar14._8_4_;
                auVar60._12_4_ = auVar14._12_4_;
                if (uVar26 != 0) {
                  for (; (uVar26 >> (long)piVar28 & 1) == 0; piVar28 = (int *)((long)piVar28 + 1)) {
                  }
                }
                do {
                  uVar34 = *(uint *)((long)&This[1].leafIntersector + (long)piVar28 * 4);
                  pGVar16 = (local_10f0->geometries).items[uVar34].ptr;
                  if ((pGVar16->mask & (uint)local_1188) == 0) {
                    *(undefined4 *)(local_1158 + (long)piVar28 * 4) = 0;
                  }
                  else {
                    pRVar17 = context->args;
                    if (pRVar17->filter == (RTCFilterFunctionN)0x0) {
                      pRVar29 = context->user;
                      if (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar104 = local_1058[(long)piVar28];
                        fVar107 = local_1048[(long)piVar28];
                        (ray->super_RayK<1>).tfar = local_1038[(long)piVar28];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar28 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + (long)piVar28 * 4);
                        (ray->Ng).field_0.field_0.z = local_1008[(long)piVar28];
                        ray->u = fVar104;
                        ray->v = fVar107;
                        uVar117 = *(uint *)((long)&This[1].collider.name + (long)piVar28 * 4);
                        This = (Intersectors *)(ulong)uVar117;
                        ray->primID = uVar117;
                        ray->geomID = uVar34;
                        ray->instID[0] = pRVar29->instID[0];
                        pauVar25 = (undefined1 (*) [16])(ulong)pRVar29->instPrimID[0];
                        ray->instPrimID[0] = pRVar29->instPrimID[0];
                        break;
                      }
                      local_1148 = auVar60._0_4_;
                      uStack_1144 = auVar60._4_4_;
                      uStack_1140 = auVar60._8_4_;
                      uStack_113c = auVar60._12_4_;
                      local_1138 = fVar104;
                      fStack_1134 = fVar107;
                      fStack_1130 = fVar98;
                      fStack_112c = fVar101;
                    }
                    else {
                      local_1148 = auVar60._0_4_;
                      uStack_1144 = auVar60._4_4_;
                      uStack_1140 = auVar60._8_4_;
                      uStack_113c = auVar60._12_4_;
                      local_1138 = fVar104;
                      fStack_1134 = fVar107;
                      fStack_1130 = fVar98;
                      fStack_112c = fVar101;
                      pRVar29 = context->user;
                    }
                    local_10e8 = *(float *)(local_1028 + (long)piVar28 * 4);
                    local_10e4 = *(undefined4 *)(local_1018 + (long)piVar28 * 4);
                    local_10e0 = local_1008[(long)piVar28];
                    local_10dc = local_1058[(long)piVar28];
                    local_10d8 = local_1048[(long)piVar28];
                    local_10d4 = *(undefined4 *)((long)&This[1].collider.name + (long)piVar28 * 4);
                    local_10d0 = uVar34;
                    local_10cc = pRVar29->instID[0];
                    local_10c8 = pRVar29->instPrimID[0];
                    (ray->super_RayK<1>).tfar = local_1038[(long)piVar28];
                    local_115c = -1;
                    local_1128.valid = &local_115c;
                    local_1128.geometryUserPtr = pGVar16->userPtr;
                    local_1128.context = pRVar29;
                    local_1128.ray = (RTCRayN *)ray;
                    local_1128.hit = (RTCHitN *)&local_10e8;
                    local_1128.N = 1;
                    local_10f8 = pGVar16;
                    local_1148 = auVar60._0_4_;
                    uStack_1144 = auVar60._4_4_;
                    uStack_1140 = auVar60._8_4_;
                    uStack_113c = auVar60._12_4_;
                    local_1138 = fVar104;
                    fStack_1134 = fVar107;
                    fStack_1130 = fVar98;
                    fStack_112c = fVar101;
                    if (((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar16->intersectionFilterN)(&local_1128), *local_1128.valid != 0)) &&
                       ((pRVar17->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar17->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_10f8->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar17->filter)(&local_1128), *local_1128.valid != 0)))))) {
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1128.hit;
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1128.hit + 4);
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1128.hit + 8);
                      *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                      *(float *)((long)local_1128.ray + 0x40) = *(float *)(local_1128.hit + 0x10);
                      *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                      *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                      *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                      *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = local_1148;
                    }
                    *(undefined4 *)(local_1158 + (long)piVar28 * 4) = 0;
                    auVar60._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar60._4_4_ = (ray->super_RayK<1>).mask;
                    auVar60._8_4_ = (ray->super_RayK<1>).id;
                    auVar60._12_4_ = (ray->super_RayK<1>).flags;
                    local_1158._0_4_ = -(uint)(local_1138 <= auVar60._0_4_) & local_1158._0_4_;
                    local_1158._4_4_ = -(uint)(fStack_1134 <= auVar60._0_4_) & local_1158._4_4_;
                    local_1158._8_4_ = -(uint)(fStack_1130 <= auVar60._0_4_) & local_1158._8_4_;
                    local_1158._12_4_ = -(uint)(fStack_112c <= auVar60._0_4_) & local_1158._12_4_;
                    uVar30 = extractps(auVar60,1);
                    local_1188._0_4_ = (uint)uVar30;
                    fVar104 = local_1138;
                    fVar107 = fStack_1134;
                    fVar98 = fStack_1130;
                    fVar101 = fStack_112c;
                  }
                  local_1188 = (ulong)(uint)local_1188;
                  local_1148 = auVar60._0_4_;
                  uStack_1144 = auVar60._4_4_;
                  uStack_1140 = auVar60._8_4_;
                  uStack_113c = auVar60._12_4_;
                  uVar34 = movmskps((int)piVar28,local_1158);
                  pauVar25 = (undefined1 (*) [16])(ulong)uVar34;
                  if (uVar34 == 0) break;
                  local_1138 = fVar104;
                  fStack_1134 = fVar107;
                  fStack_1130 = fVar98;
                  fStack_112c = fVar101;
                  BVHNIntersector1<4,16777232,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar28 = local_1128.valid;
                  auVar60._0_4_ = local_1148;
                  auVar60._4_4_ = uStack_1144;
                  auVar60._8_4_ = uStack_1140;
                  auVar60._12_4_ = uStack_113c;
                  fVar104 = local_1138;
                  fVar107 = fStack_1134;
                  fVar98 = fStack_1130;
                  fVar101 = fStack_112c;
                } while( true );
              }
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != uVar27 - 8);
        }
        fVar101 = (ray->super_RayK<1>).tfar;
        auVar72._4_4_ = fVar101;
        auVar72._0_4_ = fVar101;
        auVar72._8_4_ = fVar101;
        auVar72._12_4_ = fVar101;
        fVar68 = local_f98;
        fVar38 = fStack_f94;
        fVar49 = fStack_f90;
        fVar98 = fStack_f8c;
        fVar50 = local_fa8;
        fVar51 = fStack_fa4;
        fVar52 = fStack_fa0;
        auVar60._0_4_ = fStack_f9c;
        fVar55 = local_fb8;
        fVar56 = fStack_fb4;
        fVar57 = fStack_fb0;
        fVar108 = fStack_fac;
        fVar61 = local_fc8;
        fVar62 = fStack_fc4;
        fVar63 = fStack_fc0;
        fVar104 = fStack_fbc;
        fVar64 = local_fd8;
        fVar67 = fStack_fd4;
        fVar69 = fStack_fd0;
        fVar107 = fStack_fcc;
        fVar70 = local_fe8;
        fVar71 = fStack_fe4;
        fVar77 = fStack_fe0;
        fVar102 = fStack_fdc;
        fVar78 = local_ff8;
        fVar79 = fStack_ff4;
        fVar84 = fStack_ff0;
        fVar105 = fStack_fec;
      }
    } while (pauVar24 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }